

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOAnalyzer.cpp
# Opt level: O3

void __thiscall MDIOAnalyzer::ProcessRegAddrDevTypeFrame(MDIOAnalyzer *this)

{
  long lVar1;
  int iVar2;
  DataBuilder opcode;
  U64 value;
  Frame frame;
  DataBuilder aDStack_68 [8];
  ulong local_60;
  long local_58;
  undefined8 local_50;
  char local_38;
  undefined1 local_37;
  
  lVar1 = AnalyzerChannelData::GetSampleNumber();
  DataBuilder::DataBuilder(aDStack_68);
  iVar2 = 5;
  DataBuilder::Reset((ulonglong *)aDStack_68,(ShiftOrder)&local_60,0);
  do {
    GetBit(this,(BitState *)&local_58,&this->mMdcPosedgeArrows);
    DataBuilder::AddBit((BitState)aDStack_68);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  Frame::Frame((Frame *)&local_58);
  if ((this->mCurrentPacket).clause == MDIO_C22_PACKET) {
    local_38 = '\a';
  }
  else {
    local_38 = '\x0e';
    if (local_60 < 6) {
      local_38 = (char)local_60 + '\b';
    }
  }
  local_37 = 0;
  local_58 = lVar1 + 1;
  local_50 = AnalyzerChannelData::GetSampleNumber();
  AnalyzerResults::AddFrame((Frame *)(this->mResults)._M_ptr);
  Analyzer::ReportProgress((ulonglong)this);
  Frame::~Frame((Frame *)&local_58);
  DataBuilder::~DataBuilder(aDStack_68);
  return;
}

Assistant:

void MDIOAnalyzer::ProcessRegAddrDevTypeFrame()
{
    // starting sample of the start frame
    U64 starting_sample = mMdio->GetSampleNumber() + 1;

    // get the value of the 5 bits of register address or devtype frame
    DataBuilder opcode;
    U64 value;
    opcode.Reset( &value, AnalyzerEnums::MsbFirst, 5 );
    for( U32 i = 0; i < 5; ++i )
    {
        BitState bit;
        GetBit( bit, mMdcPosedgeArrows );
        opcode.AddBit( bit );
    }

    // create and set the phyaddr frame
    Frame frame;
    if( mCurrentPacket.clause == MDIO_C22_PACKET )
    {
        frame.mType = MDIO_C22_REGADDR;
    }
    else
    {
        frame.mType = GetDevType( value );
    }
    frame.mData1 = value;
    frame.mFlags = 0;
    frame.mStartingSampleInclusive = starting_sample;
    frame.mEndingSampleInclusive = mMdio->GetSampleNumber();

    mResults->AddFrame( frame );
    ReportProgress( frame.mEndingSampleInclusive );
}